

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstackedlayout.cpp
# Opt level: O3

void __thiscall QStackedLayout::setCurrentIndex(QStackedLayout *this,int index)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  FocusPolicy FVar5;
  QWidget *pQVar6;
  QWidget *this_00;
  QWidget *this_01;
  QWidget *pQVar7;
  int iVar8;
  QStackedLayoutPrivate *d;
  long in_FS_OFFSET;
  bool bVar9;
  QWidget *local_78;
  int *local_70;
  int local_4c;
  void *local_48;
  int *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QLayout).field_0x8;
  iVar8 = index;
  if ((long)*(int *)(lVar1 + 200) < 0) {
    pQVar6 = (QWidget *)0x0;
  }
  else {
    pQVar6 = (QWidget *)
             (**(code **)(**(long **)(*(long *)(lVar1 + 0xb8) + (long)*(int *)(lVar1 + 200) * 8) +
                         0x68))();
  }
  if ((((index < 0) ||
       (lVar2 = *(long *)&(this->super_QLayout).field_0x8,
       *(ulong *)(lVar2 + 0xc0) <= (ulong)(uint)index)) ||
      (this_00 = (QWidget *)
                 (**(code **)(**(long **)(*(long *)(lVar2 + 0xb8) + (ulong)(uint)index * 8) + 0x68))
                           (), this_00 == (QWidget *)0x0)) || (this_00 == pQVar6))
  goto LAB_002f0b42;
  this_01 = QLayout::parentWidget(&this->super_QLayout);
  bVar3 = true;
  if (this_01 == (QWidget *)0x0) {
    bVar9 = false;
LAB_002f096d:
    local_70 = (int *)0x0;
    local_78 = (QWidget *)0x0;
LAB_002f0975:
    bVar4 = false;
    if (pQVar6 != (QWidget *)0x0) {
LAB_002f097d:
      QWidget::clearFocus(pQVar6);
      if (*(int *)(lVar1 + 0xcc) == 0) {
        QWidget::hide(pQVar6);
      }
    }
  }
  else {
    bVar9 = (this_01->data->widget_attributes & 0x400) == 0;
    if (bVar9) {
      iVar8 = 0;
      QWidget::setUpdatesEnabled(this_01,false);
    }
    pQVar7 = QWidget::window(this_01);
    local_78 = QWidget::focusWidget(pQVar7);
    if (local_78 == (QWidget *)0x0) goto LAB_002f096d;
    local_70 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef(&local_78->super_QObject);
    if (local_70 == (int *)0x0) {
      local_70 = (int *)0x0;
      goto LAB_002f0975;
    }
    if (local_70[1] == 0) {
      bVar3 = false;
      goto LAB_002f0975;
    }
    if (pQVar6 != (QWidget *)0x0) {
      bVar3 = false;
      pQVar7 = local_78;
      if (local_70[1] == 0) {
        pQVar7 = (QWidget *)0x0;
      }
      bVar4 = QWidget::isAncestorOf(pQVar6,pQVar7);
      iVar8 = (int)pQVar7;
      goto LAB_002f097d;
    }
    bVar4 = false;
    bVar3 = false;
  }
  *(int *)(lVar1 + 200) = index;
  QWidget::raise(this_00,iVar8);
  QWidget::show(this_00);
  if ((this_01 != (QWidget *)0x0) && (bVar4 != false)) {
    pQVar6 = QWidget::focusWidget(this_00);
    if (pQVar6 == (QWidget *)0x0) {
      if (((!bVar3) && (local_78 != (QWidget *)0x0)) && (local_70[1] != 0)) {
        pQVar7 = QWidget::nextInFocusChain(local_78);
        pQVar6 = (QWidget *)0x0;
        if (local_70[1] != 0) {
          pQVar6 = local_78;
        }
        if (pQVar6 != pQVar7) {
          do {
            FVar5 = QWidget::focusPolicy(pQVar7);
            if (((((FVar5 & TabFocus) != NoFocus) &&
                 (pQVar6 = QWidget::focusProxy(pQVar7), pQVar6 == (QWidget *)0x0)) &&
                (bVar4 = QWidget::isVisibleTo(pQVar7,this_00), bVar4)) &&
               (((pQVar7->data->widget_attributes & 1) == 0 &&
                (bVar4 = QWidget::isAncestorOf(this_00,pQVar7), bVar4)))) {
              QWidget::setFocus(pQVar7,OtherFocusReason);
              break;
            }
            pQVar7 = QWidget::nextInFocusChain(pQVar7);
            pQVar6 = local_78;
            if (local_70[1] == 0) {
              pQVar6 = (QWidget *)0x0;
            }
          } while (pQVar6 != pQVar7);
        }
        if (local_70[1] == 0) {
          local_78 = (QWidget *)0x0;
        }
        pQVar6 = this_00;
        if (local_78 == pQVar7) goto LAB_002f09d5;
      }
    }
    else {
LAB_002f09d5:
      QWidget::setFocus(pQVar6,OtherFocusReason);
    }
  }
  if (bVar9) {
    QWidget::setUpdatesEnabled(this_01,true);
  }
  local_40 = &local_4c;
  local_48 = (void *)0x0;
  local_4c = index;
  QMetaObject::activate((QObject *)this,&staticMetaObject,1,&local_48);
  if (!bVar3) {
    LOCK();
    *local_70 = *local_70 + -1;
    UNLOCK();
    if (*local_70 == 0) {
      operator_delete(local_70);
    }
  }
LAB_002f0b42:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QStackedLayout::setCurrentIndex(int index)
{
    Q_D(QStackedLayout);
    QWidget *prev = currentWidget();
    QWidget *next = widget(index);
    if (!next || next == prev)
        return;

    bool reenableUpdates = false;
    QWidget *parent = parentWidget();

    if (parent && parent->updatesEnabled()) {
        reenableUpdates = true;
        parent->setUpdatesEnabled(false);
    }

    QPointer<QWidget> fw = parent ? parent->window()->focusWidget() : nullptr;
    const bool focusWasOnOldPage = fw && (prev && prev->isAncestorOf(fw));

    if (prev) {
        prev->clearFocus();
        if (d->stackingMode == StackOne)
            prev->hide();
    }

    d->index = index;
    next->raise();
    next->show();

    // try to move focus onto the incoming widget if focus
    // was somewhere on the outgoing widget.

    if (parent) {
        if (focusWasOnOldPage) {
            // look for the best focus widget we can find
            if (QWidget *nfw = next->focusWidget())
                nfw->setFocus();
            else {
                // second best: first child widget in the focus chain
                if (QWidget *i = fw) {
                    while ((i = i->nextInFocusChain()) != fw) {
                        if (((i->focusPolicy() & Qt::TabFocus) == Qt::TabFocus)
                            && !i->focusProxy() && i->isVisibleTo(next) && i->isEnabled()
                            && next->isAncestorOf(i)) {
                            i->setFocus();
                            break;
                        }
                    }
                    // third best: incoming widget
                    if (i == fw )
                        next->setFocus();
                }
            }
        }
    }
    if (reenableUpdates)
        parent->setUpdatesEnabled(true);
    emit currentChanged(index);
}